

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcrashhandler.cpp
# Opt level: O2

iovec QTest::CrashHandler::asyncSafeToString(int n,AsyncSafeIntBuffer *result)

{
  ulong uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  __integer_to_chars_result_type<int> _Var6;
  iovec iVar7;
  
  uVar5 = (ulong)(uint)n;
  _Var6 = std::__to_chars_i<int>((char *)result,(char *)(result + 1),n,10);
  pcVar4 = _Var6.ptr;
  if (_Var6.ec != 0) {
    pcVar3 = (char *)result;
    if (n < 0) {
      (result->array)._M_elems[0] = '-';
      uVar5 = (ulong)(uint)-n;
      pcVar3 = (result->array)._M_elems + 1;
    }
    for (uVar2 = 1000000000; (uVar2 != 0 && ((int)uVar5 < (int)uVar2)); uVar2 = uVar2 / 10) {
    }
    for (; pcVar4 = pcVar3 + 1, 1 < uVar2; uVar2 = uVar2 / 10) {
      uVar1 = uVar5 / uVar2;
      uVar5 = uVar5 % (ulong)uVar2;
      *pcVar3 = (char)uVar1 + '0';
      pcVar3 = pcVar4;
    }
    *pcVar3 = (char)uVar5 + '0';
  }
  iVar7.iov_len = (long)pcVar4 - (long)result;
  iVar7.iov_base = result;
  return iVar7;
}

Assistant:

struct iovec asyncSafeToString(int n, AsyncSafeIntBuffer &&result)
{
    char *ptr = result.array.data();
    if (false) {
#ifdef __cpp_lib_to_chars
    } else if (auto r = std::to_chars(ptr, ptr + result.array.size(), n, 10); r.ec == std::errc{}) {
        ptr = r.ptr;
#endif
    } else {
        // handle the sign
        if (n < 0) {
            *ptr++ = '-';
            n = -n;
        }

        // find the highest power of the base that is less than this number
        static constexpr int StartingDivider = ([]() {
            int divider = 1;
            for (int i = 0; i < std::numeric_limits<int>::digits10; ++i)
                divider *= 10;
            return divider;
        }());
        int divider = StartingDivider;
        while (divider && n < divider)
            divider /= 10;

        // now convert to string
        while (divider > 1) {
            int quot = n / divider;
            n = n % divider;
            divider /= 10;
            *ptr++ = quot + '0';
        }
        *ptr++ = n + '0';
    }

#ifndef QT_NO_DEBUG
    // this isn't necessary, it just helps in the debugger
    *ptr = '\0';
#endif
    struct iovec r;
    r.iov_base = result.array.data();
    r.iov_len = ptr - result.array.data();
    return r;
}